

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O0

wchar_t textui_get_spell_from_book
                  (player *p,char *verb,object *book,char *error,
                  _func__Bool_player_ptr_wchar_t *spell_filter)

{
  char *noun_00;
  class_book_conflict *pcVar1;
  menu_conflict *m_00;
  wchar_t spell_index;
  menu_conflict *m;
  char *noun;
  _func__Bool_player_ptr_wchar_t *spell_filter_local;
  char *error_local;
  object *book_local;
  char *verb_local;
  player *p_local;
  
  pcVar1 = player_object_to_book(p,book);
  noun_00 = pcVar1->realm->spell_noun;
  track_object(p->upkeep,book);
  handle_stuff(p);
  m_00 = spell_menu_new(book,spell_filter,false);
  if (m_00 == (menu_conflict *)0x0) {
    if (error != (char *)0x0) {
      msg("%s",error);
    }
    p_local._4_4_ = L'\xffffffff';
  }
  else {
    p_local._4_4_ = spell_menu_select(m_00,noun_00,verb);
    spell_menu_destroy(m_00);
  }
  return p_local._4_4_;
}

Assistant:

int textui_get_spell_from_book(struct player *p, const char *verb,
	struct object *book, const char *error,
	bool (*spell_filter)(const struct player *p, int spell_index))
{
	const char *noun = player_object_to_book(p, book)->realm->spell_noun;
	struct menu *m;

	track_object(p->upkeep, book);
	handle_stuff(p);

	m = spell_menu_new(book, spell_filter, false);
	if (m) {
		int spell_index = spell_menu_select(m, noun, verb);
		spell_menu_destroy(m);
		return spell_index;
	} else if (error) {
		msg("%s", error);
	}

	return -1;
}